

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

char * bc_str_lstrip(char *str)

{
  size_t sVar1;
  size_t str_len;
  char *pcStack_18;
  int i;
  char *str_local;
  
  if (str == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    sVar1 = strlen(str);
    for (str_len._4_4_ = 0; pcStack_18 = str, (ulong)(long)str_len._4_4_ < sVar1;
        str_len._4_4_ = str_len._4_4_ + 1) {
      if ((((str[str_len._4_4_] != ' ') && (str[str_len._4_4_] != '\t')) &&
          (str[str_len._4_4_] != '\n')) &&
         (((str[str_len._4_4_] != '\r' && (str[str_len._4_4_] != '\t')) &&
          ((str[str_len._4_4_] != '\f' && (str[str_len._4_4_] != '\v')))))) {
        pcStack_18 = str + str_len._4_4_;
        break;
      }
      if ((long)str_len._4_4_ == sVar1 - 1) {
        pcStack_18 = str + sVar1;
        break;
      }
    }
    str_local = pcStack_18;
  }
  return str_local;
}

Assistant:

char*
bc_str_lstrip(char *str)
{
    if (str == NULL)
        return NULL;
    int i;
    size_t str_len = strlen(str);
    for (i = 0; i < str_len; i++) {
        if ((str[i] != ' ') && (str[i] != '\t') && (str[i] != '\n') &&
            (str[i] != '\r') && (str[i] != '\t') && (str[i] != '\f') &&
            (str[i] != '\v'))
        {
            str += i;
            break;
        }
        if (i == str_len - 1) {
            str += str_len;
            break;
        }
    }
    return str;
}